

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O1

void RigidBodyDynamics::Math::SparseSolveLTx(Model *model,MatrixNd *L,VectorNd *x)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((ulong)model->qdot_size != 0) {
    pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    puVar4 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)model->qdot_size;
    do {
      uVar6 = uVar5 - 1;
      pdVar1[uVar5 - 1] = pdVar1[uVar5 - 1] / pdVar2[uVar5 + lVar3 * uVar6 + -1];
      for (uVar7 = puVar4[uVar5]; uVar7 != 0; uVar7 = puVar4[uVar7]) {
        uVar8 = (ulong)(uVar7 - 1);
        pdVar1[uVar8] = pdVar1[uVar8] - pdVar2[uVar5 + lVar3 * uVar8 + -1] * pdVar1[uVar5 - 1];
      }
      uVar5 = uVar6;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseSolveLTx (Model &model, Math::MatrixNd &L, Math::VectorNd &x) {
  for (unsigned int i = model.qdot_size; i > 0; i--) {
    x[i - 1] = x[i - 1] / L(i - 1,i - 1);
    unsigned int j = model.lambda_q[i];
    while (j != 0) {
      x[j - 1] = x[j - 1] - L(i - 1,j - 1) * x[i - 1];
      j = model.lambda_q[j];
    }
  }
}